

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_processor.cc
# Opt level: O2

Status __thiscall
sentencepiece::SentencePieceProcessor::Decode
          (SentencePieceProcessor *this,vector<int,_std::allocator<int>_> *ids,string *detokenized)

{
  ostringstream *this_00;
  string *psVar1;
  string *in_RCX;
  Status *_status;
  SentencePieceText spt;
  undefined1 local_1a8 [384];
  
  (**(code **)((ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_start + 0xe))();
  if (this->_vptr_SentencePieceProcessor == (_func_int **)0x0) {
    util::Status::~Status((Status *)this);
    if (in_RCX == (string *)0x0) {
      this_00 = (ostringstream *)(local_1a8 + 8);
      local_1a8._0_4_ = 0xd;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,"third_party/sentencepiece/src/sentencepiece_processor.cc")
      ;
      std::operator<<((ostream *)this_00,"(");
      std::ostream::operator<<(this_00,0x1a8);
      std::operator<<((ostream *)this_00,") [");
      std::operator<<((ostream *)this_00,"detokenized");
      std::operator<<((ostream *)this_00,"] ");
      std::operator<<((ostream *)this_00,"output container is null");
      util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
      std::__cxx11::ostringstream::~ostringstream(this_00);
    }
    else {
      *(undefined8 *)(in_RCX + 8) = 0;
      **(undefined1 **)in_RCX = 0;
      SentencePieceText::SentencePieceText((SentencePieceText *)local_1a8);
      (**(code **)((ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start + 0x3e))(this,ids,detokenized,local_1a8);
      if (this->_vptr_SentencePieceProcessor == (_func_int **)0x0) {
        util::Status::~Status((Status *)this);
        psVar1 = SentencePieceText::_internal_mutable_text_abi_cxx11_
                           ((SentencePieceText *)local_1a8);
        std::__cxx11::string::operator=(in_RCX,(string *)psVar1);
        util::Status::Status((Status *)this);
      }
      SentencePieceText::~SentencePieceText((SentencePieceText *)local_1a8);
    }
  }
  return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
          )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
            )this;
}

Assistant:

util::Status SentencePieceProcessor::Decode(const std::vector<int> &ids,
                                            std::string *detokenized) const {
  CHECK_OR_RETURN_STATUS_STL(detokenized);

  SentencePieceText spt;
  RETURN_IF_ERROR(Decode(ids, &spt));
  *detokenized = std::move(*spt.mutable_text());

  return util::OkStatus();
}